

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_math.c
# Opt level: O3

double p2sc_circleoverlap(double R,double r,double d)

{
  undefined1 auVar1 [16];
  undefined4 in_EAX;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar9;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  dVar6 = 0.0;
  if (d < R + r) {
    dVar9 = R * R;
    dVar6 = r * r;
    dVar3 = dVar6 / dVar9;
    if ((d != 0.0) || (NAN(d))) {
      auVar7._0_8_ = (d * d + dVar6) - R * R;
      auVar7._8_8_ = (dVar9 + d * d) - r * r;
      auVar8._8_8_ = R * (d + d);
      auVar8._0_8_ = r * (d + d);
      auVar8 = divpd(auVar7,auVar8);
      auVar1._8_8_ = -(ulong)(1.0 < ABS(auVar8._8_8_));
      auVar1._0_8_ = -(ulong)(1.0 < ABS(auVar8._0_8_));
      iVar2 = movmskpd(in_EAX,auVar1);
      if (iVar2 == 0) {
        dVar3 = acos(auVar8._0_8_);
        dVar4 = acos(auVar8._8_8_);
        dVar5 = (r + d + R) * ((d - r) + R) * ((r + d) - R) * ((r - d) + R);
        if (dVar5 < 0.0) {
          dVar5 = sqrt(dVar5);
        }
        else {
          dVar5 = SQRT(dVar5);
        }
        dVar3 = (dVar5 * -0.5 + dVar3 * dVar6 + dVar4 * dVar9) / (dVar9 * 3.141592653589793);
      }
    }
    dVar6 = 1.0;
    if (dVar3 <= 1.0) {
      dVar6 = dVar3;
    }
  }
  return dVar6;
}

Assistant:

double p2sc_circleoverlap(double R, double r, double d) {
    double f, R2 = R * R, r2 = r * r, d2 = d * d;

    if (d >= R + r)
        return 0;

    f = r2 / R2;

    if (d) {
        double ia;
        double a1 = (d2 + r2 - R2) / (2 * d * r);
        double a2 = (d2 + R2 - r2) / (2 * d * R);

        if (fabs(a1) <= 1 && fabs(a2) <= 1) {
            ia = r2 * acos(a1) + R2 * acos(a2) -
                0.5 * sqrt((-d + r + R) * (d + r - R) * (d - r + R) * (d + r + R));

            f = ia / (M_PI * R2);
        }
    }

    if (f > 1)
        f = 1;

    return f;
}